

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O2

void __thiscall ParserProbModelXML::Parse(ParserProbModelXML *this)

{
  FactoredDecPOMDPDiscrete *pFVar1;
  ProbModelXMLTransitionProbFunctor tf;
  ProbModelXMLScopeFunctor sf;
  ProbModelXMLObservationProbFunctor of;
  
  xmlInitParser();
  InitializeXPath(this);
  ReadProperties(this);
  ReadAgents(this);
  ReadStates(this);
  ReadActions(this);
  ReadObservations(this);
  InitializeLRFs(this);
  pFVar1 = this->_m_fDecPOMDP;
  (pFVar1->super_MultiAgentDecisionProcessDiscreteFactoredStates)._m_eventObservability =
       this->_m_asynchronousModel;
  (**(code **)(*(long *)&(pFVar1->super_MultiAgentDecisionProcessDiscreteFactoredStates).
                         super_MultiAgentDecisionProcess + 0x248))();
  SetISD(this);
  ReadLRFs(this);
  xmlXPathFreeContext(this->_m_context);
  xmlCleanupParser();
  return;
}

Assistant:

void ParserProbModelXML::Parse()
{   
#ifdef HAVE_LIBXML2
    xmlInitParser(); 
    //Parse
    try{
        InitializeXPath();
        ReadProperties();
        ReadAgents();
        ReadStates();
        ReadActions();
        ReadObservations();
        InitializeLRFs();

        ProbModelXMLScopeFunctor sf(this,_m_fDecPOMDP);
        ProbModelXMLTransitionProbFunctor tf(this,_m_fDecPOMDP);
        ProbModelXMLObservationProbFunctor of(this,_m_fDecPOMDP);
        _m_fDecPOMDP->SetEventObservability(_m_asynchronousModel);
        _m_fDecPOMDP->Initialize2DBN(sf,tf,of);
        SetISD();
        ReadLRFs();

        xmlXPathFreeContext(GetContext());

      if(DEBUG_PARSE) cout << ">>>Parsing succeeded\n";
    }    
    catch(E& e)
    {
        e.Print();
    }
    xmlCleanupParser();
    if(DEBUG_PARSE)  cout << "-------------------------\n";
#else

    throw(E("ParserProbModelXML: not compiled with libxml2 support"));
#endif

    return;
}